

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O2

void __thiscall features::Sift::set_image(Sift *this,ConstPtr *img)

{
  invalid_argument *this_00;
  ConstPtr *this_01;
  __shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  if (((((img->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr)->super_TypedImageBase<unsigned_char>).super_ImageBase.c | 2U) == 3) {
    std::__shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               &img->
                super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>);
    core::image::byte_to_float_image((image *)&local_30,(ConstPtr *)&local_50);
    this_01 = &this->orig;
    std::__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2> *)this_01,&local_30
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    if ((((img->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr)->super_TypedImageBase<unsigned_char>).super_ImageBase.c == 3) {
      std::__shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,
                 &this_01->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)
      ;
      core::image::desaturate<float>((image *)&local_30,(ConstPtr *)&local_40,DESATURATE_AVERAGE);
      std::__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2> *)this_01,
                 &local_30);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    }
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Gray or color image expected");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
Sift::set_image (core::ByteImage::ConstPtr img)
{
    if (img->channels() != 1 && img->channels() != 3)
        throw std::invalid_argument("Gray or color image expected");

    // 将图像转化成灰度图
    this->orig = core::image::byte_to_float_image(img);
    if (img->channels() == 3) {
        this->orig = core::image::desaturate<float>
            (this->orig, core::image::DESATURATE_AVERAGE);
    }
}